

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QRegion * __thiscall QWidgetPrivate::getOpaqueChildren(QWidgetPrivate *this)

{
  int iVar1;
  QRegionData *pQVar2;
  long lVar3;
  QWidgetPrivate *this_00;
  QWExtra *pQVar4;
  char cVar5;
  long lVar6;
  QRegion *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QRegion r;
  QRect local_50;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x252 & 1) != 0) {
    QRegion::QRegion((QRegion *)&local_50);
    pQVar2 = (this->opaqueChildren).d;
    (this->opaqueChildren).d = (QRegionData *)local_50._0_8_;
    local_50._0_8_ = pQVar2;
    QRegion::~QRegion((QRegion *)&local_50);
    if (*(long *)&this->field_0x28 != 0) {
      uVar8 = 0;
      do {
        lVar6 = *(long *)(*(long *)&this->field_0x20 + uVar8 * 8);
        if ((lVar6 == 0) || ((*(byte *)(*(long *)(lVar6 + 8) + 0x30) & 1) == 0)) {
          lVar6 = 0;
        }
        if (((lVar6 != 0) && (lVar3 = *(long *)(lVar6 + 0x20), (*(byte *)(lVar3 + 9) & 0x80) != 0))
           && ((*(byte *)(lVar3 + 0xc) & 1) == 0)) {
          iVar1 = *(int *)(lVar3 + 0x14);
          this_00 = *(QWidgetPrivate **)(lVar6 + 8);
          local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          if ((*(uint *)&this_00->field_0x250 >> 0x11 & 1) == 0) {
            pQVar7 = getOpaqueChildren(this_00);
            QRegion::QRegion(&local_40,pQVar7);
          }
          else {
            local_50.x2.m_i = *(int *)(lVar3 + 0x1c) - iVar1;
            local_50.y2.m_i = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
            local_50._0_8_ = (QRegionData *)0x0;
            QRegion::QRegion(&local_40,&local_50,Rectangle);
          }
          pQVar4 = (this_00->extra)._M_t.
                   super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                   super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                   super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
          if ((pQVar4 != (QWExtra *)0x0) && ((pQVar4->field_0x7c & 0x80) != 0)) {
            QRegion::operator&=(&local_40,&pQVar4->mask);
          }
          cVar5 = QRegion::isEmpty();
          if (cVar5 == '\0') {
            QRegion::translate((int)&local_40,iVar1);
            QRegion::operator+=(&this->opaqueChildren,&local_40);
          }
          QRegion::~QRegion(&local_40);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(ulong *)&this->field_0x28);
    }
    lVar6 = *(long *)(*(long *)&this->field_0x8 + 0x20);
    local_50.x2.m_i = *(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14);
    local_50.y2.m_i = *(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18);
    local_50._0_8_ = (QRegionData *)0x0;
    QRegion::operator&=(&this->opaqueChildren,&local_50);
    this->field_0x252 = this->field_0x252 & 0xfe;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this->opaqueChildren;
}

Assistant:

const QRegion &QWidgetPrivate::getOpaqueChildren() const
{
    if (!dirtyOpaqueChildren)
        return opaqueChildren;

    QWidgetPrivate *that = const_cast<QWidgetPrivate*>(this);
    that->opaqueChildren = QRegion();

    for (int i = 0; i < children.size(); ++i) {
        QWidget *child = qobject_cast<QWidget *>(children.at(i));
        if (!child || !child->isVisible() || child->isWindow())
            continue;

        const QPoint offset = child->geometry().topLeft();
        QWidgetPrivate *childd = child->d_func();
        QRegion r = childd->isOpaque ? child->rect() : childd->getOpaqueChildren();
        if (childd->extra && childd->extra->hasMask)
            r &= childd->extra->mask;
        if (r.isEmpty())
            continue;
        r.translate(offset);
        that->opaqueChildren += r;
    }

    that->opaqueChildren &= q_func()->rect();
    that->dirtyOpaqueChildren = false;

    return that->opaqueChildren;
}